

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fVerbose)

{
  Wlc_Obj_t *pWVar1;
  ushort uVar2;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  void *pvVar3;
  ulong uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  undefined4 *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *vTypes;
  void **__ptr_01;
  Vec_Ptr_t *vOccurs;
  void **__ptr_02;
  undefined8 *puVar8;
  void *pvVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *paVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  Wlc_Obj_t *pWVar14;
  Wlc_Obj_t *pWVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  word Entry;
  char *pcVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int i;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  double dVar28;
  void *local_78;
  
  __ptr = (undefined4 *)malloc(0x10);
  *__ptr = 0x36;
  __ptr_00 = calloc(1,0xd8);
  *(void **)(__ptr + 2) = __ptr_00;
  __ptr[1] = 0x36;
  vTypes = (Vec_Ptr_t *)malloc(0x10);
  vTypes->nCap = 0x36;
  __ptr_01 = (void **)calloc(1,0x1b0);
  vTypes->pArray = __ptr_01;
  vTypes->nSize = 0x36;
  vOccurs = (Vec_Ptr_t *)malloc(0x10);
  vOccurs->nCap = 0x36;
  __ptr_02 = (void **)calloc(1,0x1b0);
  vOccurs->pArray = __ptr_02;
  vOccurs->nSize = 0x36;
  lVar25 = 0;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0x10;
    pvVar9 = malloc(0x80);
    puVar8[1] = pvVar9;
    __ptr_01[lVar25] = puVar8;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x36);
  lVar25 = 0;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0x10;
    pvVar9 = malloc(0x80);
    puVar8[1] = pvVar9;
    __ptr_02[lVar25] = puVar8;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x36);
  if (1 < p->iObj) {
    uVar27 = 1;
    iVar20 = 0x36;
    uVar24 = 0;
    pWVar14 = (Wlc_Obj_t *)0x0;
    local_78 = __ptr_00;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar27) goto LAB_0030ec2c;
      pWVar1 = p->pObjs + uVar27;
      iVar13 = pWVar1->Beg;
      iVar6 = pWVar1->End - iVar13;
      iVar17 = -iVar6;
      if (0 < iVar6) {
        iVar17 = iVar6;
      }
      if (iVar17 * 2 - 0x1ffffeU < 0xffe00000) {
        printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
               uVar27 & 0xffffffff,(ulong)(iVar17 + 1U),(ulong)(iVar17 + 1U & 0xfffff));
        iVar13 = pWVar1->Beg;
      }
      pWVar15 = pWVar14;
      if (pWVar14 == (Wlc_Obj_t *)0x0) {
        pWVar15 = pWVar1;
      }
      if (iVar13 == 0) {
        pWVar15 = pWVar14;
      }
      uVar2 = *(ushort *)pWVar1;
      if ((uVar2 & 0x3d) == 1) {
        uVar5 = uVar2 & 3;
LAB_0030ce7a:
        iVar6 = pWVar1->End - iVar13;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        Entry = (word)((uVar2 >> 6 & 1) + iVar17 * 2 + 2);
      }
      else {
        uVar7 = uVar2 & 0x3f;
        uVar5 = (ushort)uVar7;
        if (uVar5 < 0x36) {
          if ((0x24000007408080U >> uVar7 & 1) != 0) {
            iVar6 = pWVar1->End - iVar13;
            iVar17 = -iVar6;
            if (0 < iVar6) {
              iVar17 = iVar6;
            }
            paVar10 = &pWVar1->field_9;
            if ((uVar5 == 0x16) || (2 < pWVar1->nFanins)) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
            }
            lVar25 = (long)paVar10->Fanins[0];
            if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
            pWVar14 = p->pObjs;
            iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
            iVar6 = -iVar22;
            if (0 < iVar22) {
              iVar6 = iVar22;
            }
            Entry = (ulong)((uVar2 >> 6 & 1) + iVar17 * 2 + 2) |
                    (ulong)((*(uint *)(pWVar14 + lVar25) >> 6 & 1) + iVar6 * 2 + 2) << 0x15;
            goto LAB_0030cf3b;
          }
          if ((0x800040UL >> uVar7 & 1) != 0) goto LAB_0030ce7a;
        }
        uVar18 = pWVar1->nFanins;
        if (uVar18 == 1) {
          iVar6 = pWVar1->End - iVar13;
          iVar17 = -iVar6;
          if (0 < iVar6) {
            iVar17 = iVar6;
          }
          if ((uVar7 | 0x10) == 0x16) {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)(pWVar1->field_9).pFanins[0];
          }
          else {
            paVar10 = &pWVar1->field_9;
          }
          lVar25 = (long)paVar10->Fanins[0];
          if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
          pWVar14 = p->pObjs;
          iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
          iVar6 = -iVar22;
          if (0 < iVar22) {
            iVar6 = iVar22;
          }
          Entry = (ulong)((uVar2 >> 6 & 1) + iVar17 * 2 + 2) |
                  (ulong)((*(uint *)(pWVar14 + lVar25) >> 6 & 1) + iVar6 * 2 + 2) << 0x15;
        }
        else {
          if ((int)uVar18 < 2) {
            __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                          ,0x155,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int)");
          }
          iVar6 = pWVar1->End - iVar13;
          iVar17 = -iVar6;
          if (0 < iVar6) {
            iVar17 = iVar6;
          }
          if ((uVar18 == 2) && ((uVar7 | 0x10) != 0x16)) {
            paVar10 = &pWVar1->field_9;
          }
          else {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)(pWVar1->field_9).pFanins[0];
          }
          lVar25 = (long)paVar10->Fanins[0];
          if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
          pWVar14 = p->pObjs;
          iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
          iVar6 = -iVar22;
          if (0 < iVar22) {
            iVar6 = iVar22;
          }
          if ((uVar18 == 2) && ((uVar7 | 0x10) != 0x16)) {
            paVar10 = &pWVar1->field_9;
          }
          else {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)(pWVar1->field_9).pFanins[0];
          }
          lVar21 = (long)paVar10->Fanins[1];
          if ((lVar21 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
          iVar23 = pWVar14[lVar21].End - pWVar14[lVar21].Beg;
          iVar22 = -iVar23;
          if (0 < iVar23) {
            iVar22 = iVar23;
          }
          Entry = (ulong)((uVar2 >> 6 & 1) + iVar17 * 2 + 2) |
                  (ulong)((*(uint *)(pWVar14 + lVar21) >> 6 & 1) + iVar22 * 2 + 2) << 0x2a |
                  (ulong)((*(uint *)(pWVar14 + lVar25) >> 6 & 1) + iVar6 * 2 + 2) << 0x15;
        }
        if (0x35 < uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
      }
LAB_0030cf3b:
      p_00 = (Vec_Wrd_t *)__ptr_01[uVar5];
      p_01 = (Vec_Wrd_t *)__ptr_02[uVar5];
      if (0 < (long)p_00->nSize) {
        lVar25 = 0;
        do {
          if (p_00->pArray[lVar25] == Entry) {
            if (p_01->nSize <= (int)lVar25) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                            ,0x1bf,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
            }
            p_01->pArray[lVar25] = p_01->pArray[lVar25] + 1;
            goto LAB_0030cf9d;
          }
          lVar25 = lVar25 + 1;
        } while (p_00->nSize != lVar25);
      }
      Vec_WrdPush(p_00,Entry);
      Vec_WrdPush(p_01,1);
LAB_0030cf9d:
      switch(*(ushort *)pWVar1 & 0x3f) {
      case 8:
        iVar20 = __ptr[1];
        if (iVar20 < 9) {
LAB_0030ec6a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        iVar6 = pWVar1->End - pWVar1->Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x20) =
             *(int *)((long)local_78 + 0x20) + (pWVar1->nFanins - 2) * (iVar17 * 3 + 3);
        break;
      case 9:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 10) goto LAB_0030ec6a;
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar7 = -uVar18;
        if (0 < (int)uVar18) {
          uVar7 = uVar18;
        }
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar7 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar7 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar18 = iVar17 + 1U;
        if (uVar7 <= iVar17 + 1U) {
          uVar18 = uVar7;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x24) = *(int *)((long)local_78 + 0x24) + uVar18 * 3;
        break;
      case 10:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar7 = -uVar18;
        if (0 < (int)uVar18) {
          uVar7 = uVar18;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0xb) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar12 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar12 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar17 + 1U < uVar12) {
          uVar12 = iVar17 + 1U;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x28) = *(int *)((long)local_78 + 0x28) + (uVar7 * 3 + 3) * uVar12
        ;
        break;
      case 0xb:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar7 = -uVar18;
        if (0 < (int)uVar18) {
          uVar7 = uVar18;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0xc) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar12 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar12 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar17 + 1U < uVar12) {
          uVar12 = iVar17 + 1U;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x2c) = *(int *)((long)local_78 + 0x2c) + (uVar7 * 3 + 3) * uVar12
        ;
        break;
      case 0xc:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar7 = -uVar18;
        if (0 < (int)uVar18) {
          uVar7 = uVar18;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0xd) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar12 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar12 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar17 + 1U < uVar12) {
          uVar12 = iVar17 + 1U;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x30) = *(int *)((long)local_78 + 0x30) + (uVar7 * 3 + 3) * uVar12
        ;
        break;
      case 0xd:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar7 = -uVar18;
        if (0 < (int)uVar18) {
          uVar7 = uVar18;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0xe) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar12 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar12 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar17 + 1U < uVar12) {
          uVar12 = iVar17 + 1U;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x34) = *(int *)((long)local_78 + 0x34) + (uVar7 * 3 + 3) * uVar12
        ;
        break;
      case 0xe:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar7 = -uVar18;
        if (0 < (int)uVar18) {
          uVar7 = uVar18;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0xf) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar12 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar12 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar17 + 1U < uVar12) {
          uVar12 = iVar17 + 1U;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x38) = *(int *)((long)local_78 + 0x38) + (uVar7 * 3 + 3) * uVar12
        ;
        break;
      case 0xf:
        iVar20 = __ptr[1];
        if (iVar20 < 0x10) goto LAB_0030ec6a;
        break;
      case 0x10:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x11) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x40) = iVar17 + *(int *)((long)local_78 + 0x40) + 1;
        break;
      case 0x11:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x12) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x44) = iVar17 + *(int *)((long)local_78 + 0x44) + 1;
        break;
      case 0x12:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x13) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x48) = iVar17 * 3 + *(int *)((long)local_78 + 0x48) + 3;
        break;
      case 0x13:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x14) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x4c) = iVar17 + *(int *)((long)local_78 + 0x4c) + 1;
        break;
      case 0x14:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x15) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x50) = iVar17 + *(int *)((long)local_78 + 0x50) + 1;
        break;
      case 0x15:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x16) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x54) = iVar17 * 3 + *(int *)((long)local_78 + 0x54) + 3;
        break;
      case 0x16:
        iVar20 = __ptr[1];
        if (iVar20 < 0x17) goto LAB_0030ec6a;
        break;
      case 0x17:
        iVar20 = __ptr[1];
        if (iVar20 < 0x18) goto LAB_0030ec6a;
        break;
      case 0x18:
        iVar20 = __ptr[1];
        if (iVar20 < 0x19) goto LAB_0030ec6a;
        break;
      case 0x19:
        iVar20 = __ptr[1];
        if (iVar20 < 0x1a) goto LAB_0030ec6a;
        break;
      case 0x1a:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x1b) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x68) = *(int *)((long)local_78 + 0x68) + iVar17;
        break;
      case 0x1b:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) {
LAB_0030ec2c:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                        ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar14 = p->pObjs;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar20;
        if (0 < iVar20) {
          iVar17 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x1c) goto LAB_0030ec6a;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x6c) = iVar17 + iVar6 + *(int *)((long)local_78 + 0x6c) + 1;
        break;
      case 0x1c:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar20;
        if (0 < iVar20) {
          iVar17 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x1d) goto LAB_0030ec6a;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x70) = iVar17 + iVar6 + *(int *)((long)local_78 + 0x70) + 1;
        break;
      case 0x1d:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar20;
        if (0 < iVar20) {
          iVar17 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x1e) goto LAB_0030ec6a;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x74) = iVar17 + iVar6 + *(int *)((long)local_78 + 0x74) + 1;
        break;
      case 0x1e:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar20;
        if (0 < iVar20) {
          iVar17 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x1f) goto LAB_0030ec6a;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x78) = iVar17 + iVar6 + *(int *)((long)local_78 + 0x78) + 3;
        break;
      case 0x1f:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x20) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x7c) = *(int *)((long)local_78 + 0x7c) + iVar17 * 4 + 3;
        break;
      case 0x20:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x21) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x80) = *(int *)((long)local_78 + 0x80) + iVar17 * 4 + 3;
        break;
      case 0x21:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x22) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x84) = *(int *)((long)local_78 + 0x84) + iVar17 * 6;
        break;
      case 0x22:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x23) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x88) = *(int *)((long)local_78 + 0x88) + iVar17 * 6;
        break;
      case 0x23:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x24) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x8c) = *(int *)((long)local_78 + 0x8c) + iVar17 * 6;
        break;
      case 0x24:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x25) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x90) = *(int *)((long)local_78 + 0x90) + iVar17 * 6;
        break;
      case 0x25:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x26) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x94) = *(int *)((long)local_78 + 0x94) + iVar17;
        break;
      case 0x26:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x27) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x98) = *(int *)((long)local_78 + 0x98) + iVar17;
        break;
      case 0x27:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x28) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0x9c) = *(int *)((long)local_78 + 0x9c) + iVar17 * 3;
        break;
      case 0x28:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x29) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0xa0) = *(int *)((long)local_78 + 0xa0) + iVar17;
        break;
      case 0x29:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x2a) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0xa4) = *(int *)((long)local_78 + 0xa4) + iVar17;
        break;
      case 0x2a:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x2b) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        local_78 = *(void **)(__ptr + 2);
        *(int *)((long)local_78 + 0xa8) = *(int *)((long)local_78 + 0xa8) + iVar17 * 3;
        break;
      case 0x2b:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x2c) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        *(int *)((long)local_78 + 0xac) = iVar17 * 9 + *(int *)((long)local_78 + 0xac) + 9;
        break;
      case 0x2c:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x2d) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        *(int *)((long)local_78 + 0xb0) = iVar17 * 9 + *(int *)((long)local_78 + 0xb0) + 9;
        break;
      case 0x2d:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar20;
        if (0 < iVar20) {
          iVar17 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x2e) goto LAB_0030ec6a;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        *(int *)((long)local_78 + 0xb4) =
             *(int *)((long)local_78 + 0xb4) + (iVar6 + 1) * (iVar17 * 9 + 9);
        break;
      case 0x2e:
        uVar7 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar20;
        if (0 < iVar20) {
          iVar17 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar20;
        if (0 < iVar20) {
          iVar6 = iVar20;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar20 = __ptr[1];
        if (iVar20 < 0x2f) goto LAB_0030ec6a;
        iVar23 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar22 = -iVar23;
        if (0 < iVar23) {
          iVar22 = iVar23;
        }
        *(int *)((long)local_78 + 0xb8) =
             iVar22 * -0x13 + (iVar6 + 1) * (iVar17 * 0xd + 0xd) + *(int *)((long)local_78 + 0xb8) +
             -9;
        break;
      case 0x2f:
        uVar7 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar6 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        if (iVar20 < 0x30) goto LAB_0030ec6a;
        iVar23 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar22 = -iVar23;
        if (0 < iVar23) {
          iVar22 = iVar23;
        }
        *(int *)((long)local_78 + 0xbc) =
             iVar22 * -7 + (iVar6 + 1) * (iVar17 * 0xd + 0xd) + *(int *)((long)local_78 + 0xbc) + -9
        ;
        break;
      case 0x30:
        uVar7 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar6 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        if (iVar20 < 0x31) goto LAB_0030ec6a;
        iVar23 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar22 = -iVar23;
        if (0 < iVar23) {
          iVar22 = iVar23;
        }
        *(int *)((long)local_78 + 0xc0) =
             iVar22 * -7 + (iVar6 + 1) * (iVar17 * 0xd + 0xd) + *(int *)((long)local_78 + 0xc0) + -9
        ;
        break;
      case 0x31:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar6 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        dVar28 = pow((double)(iVar17 + 1),(double)(iVar6 + 1));
        if (iVar20 < 0x32) goto LAB_0030ec6a;
        *(int *)((long)local_78 + 0xc4) = *(int *)((long)local_78 + 0xc4) + (int)dVar28 * 10;
        break;
      case 0x32:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        if (iVar20 < 0x33) goto LAB_0030ec6a;
        iVar6 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        *(int *)((long)local_78 + 200) = *(int *)((long)local_78 + 200) + iVar17 * 4 + 4;
        break;
      case 0x33:
        uVar7 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar6 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < uVar7) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0030ec2c;
        if (iVar20 < 0x34) goto LAB_0030ec6a;
        iVar23 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar22 = -iVar23;
        if (0 < iVar23) {
          iVar22 = iVar23;
        }
        *(uint *)((long)local_78 + 0xcc) =
             (iVar22 * 5 + 5U >> 1) +
             ((uint)((iVar6 + 1) * (iVar17 * 0xb + 0xb)) >> 3) + *(int *)((long)local_78 + 0xcc) +
             -5;
        break;
      case 0x34:
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec2c;
        pWVar14 = p->pObjs;
        iVar6 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        paVar10 = &pWVar1->field_9;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0030ec2c;
        if (iVar20 < 0x35) goto LAB_0030ec6a;
        iVar22 = pWVar14[lVar25].End - pWVar14[lVar25].Beg;
        iVar6 = -iVar22;
        if (0 < iVar22) {
          iVar6 = iVar22;
        }
        *(int *)((long)local_78 + 0xd0) =
             *(int *)((long)local_78 + 0xd0) + (iVar6 + 1) * (iVar17 * 5 + 5);
      }
      uVar24 = uVar24 + (iVar13 != 0);
      uVar27 = uVar27 + 1;
      pWVar14 = pWVar15;
    } while ((long)uVar27 < (long)p->iObj);
    if (uVar24 != 0) {
      printf("Warning: %d objects of the design have non-zero-based ranges.\n",(ulong)uVar24);
      uVar27 = ((long)pWVar15 - (long)p->pObjs >> 3) * -0x5555555555555555;
      uVar24 = (uint)uVar27;
      if (((int)uVar24 < 0) || ((p->vNameIds).nSize <= (int)uVar24)) {
LAB_0030ec4b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pcVar11 = Abc_NamStr(p->pManName,(p->vNameIds).pArray[uVar24 & 0x7fffffff]);
      iVar13 = pWVar15->End - pWVar15->Beg;
      iVar20 = -iVar13;
      if (0 < iVar13) {
        iVar20 = iVar13;
      }
      printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",uVar27 & 0xffffffff
             ,pcVar11,(ulong)(iVar20 + 1));
    }
  }
  puts("ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...")
  ;
  uVar27 = 0;
  do {
    if (p->nObjs[uVar27] != 0) {
      if ((long)(int)__ptr[1] <= (long)uVar27) goto LAB_0030ec4b;
      pvVar9 = __ptr_01[uVar27];
      pvVar3 = __ptr_02[uVar27];
      printf("%2d  :  %-8s  %6d%8d ",uVar27 & 0xffffffff,Wlc_Names[uVar27],
             (ulong)(uint)p->nObjs[uVar27],(ulong)*(uint *)((long)__ptr_00 + uVar27 * 4));
      Wlc_NtkPrintDistribSortOne(vTypes,vOccurs,(int)uVar27);
      pcVar11 = "-";
      if (0 < *(int *)((long)pvVar9 + 4)) {
        uVar16 = 0;
        do {
          uVar4 = *(ulong *)(*(long *)((long)pvVar9 + 8) + uVar16 * 8);
          if ((((int)(uVar16 / 6) * 6 + 5U == (uint)uVar16) && (0x3ffffffffff < uVar4)) ||
             (((~(uint)uVar16 & 7) == 0 && (uVar4 < 0x40000000000)))) {
            printf("\n                                ");
          }
          if ((long)*(int *)((long)pvVar3 + 4) <= (long)uVar16) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          uVar26 = uVar4 >> 0x15;
          printf("(%d)",(ulong)*(uint *)(*(long *)((long)pvVar3 + 8) + uVar16 * 8));
          pcVar19 = pcVar11;
          if ((uVar4 & 1) == 0) {
            pcVar19 = "";
          }
          printf("%s%d",pcVar19,(ulong)((uint)(uVar4 >> 1) & 0xfffff));
          if ((uVar26 & 0x1fffff) != 0) {
            pcVar19 = pcVar11;
            if ((uVar26 & 1) == 0) {
              pcVar19 = "";
            }
            printf("=%s%d",pcVar19,(ulong)(((uint)uVar26 & 0x1fffff) >> 1));
          }
          if (0x3ffffffffff < uVar4) {
            pcVar19 = pcVar11;
            if ((uVar4 >> 0x2a & 1) == 0) {
              pcVar19 = "";
            }
            printf(".%s%d",pcVar19,uVar4 >> 0x2b);
          }
          putchar(0x20);
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)*(int *)((long)pvVar9 + 4));
      }
      putchar(10);
    }
    uVar27 = uVar27 + 1;
    if (uVar27 == 0x36) {
      lVar25 = 0;
      do {
        pvVar9 = __ptr_01[lVar25];
        if (pvVar9 != (void *)0x0) {
          if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar9 + 8));
          }
          free(pvVar9);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x36);
      free(__ptr_01);
      free(vTypes);
      lVar25 = 0;
      do {
        pvVar9 = __ptr_02[lVar25];
        if (pvVar9 != (void *)0x0) {
          if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar9 + 8));
          }
          free(pvVar9);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x36);
      free(__ptr_02);
      free(vOccurs);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fVerbose )
{
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign;
    int i, k, s, s0, s1;
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, Wlc_Names[i], p->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}